

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

size_t __thiscall CoreML::Specification::SerializedModel::ByteSizeLong(SerializedModel *this)

{
  long lVar1;
  ulong uVar2;
  int iVar3;
  size_t sVar4;
  uint uVar5;
  
  lVar1 = *(long *)(((ulong)(this->identifier_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar1 == 0) {
    sVar4 = 0;
  }
  else {
    uVar5 = (uint)lVar1 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar4 = lVar1 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  lVar1 = *(long *)(((ulong)(this->model_).tagged_ptr_.ptr_ & 0xfffffffffffffffe) + 8);
  if (lVar1 != 0) {
    uVar5 = (uint)lVar1 | 1;
    iVar3 = 0x1f;
    if (uVar5 != 0) {
      for (; uVar5 >> iVar3 == 0; iVar3 = iVar3 + -1) {
      }
    }
    sVar4 = sVar4 + lVar1 + (ulong)(iVar3 * 9 + 0x49U >> 6) + 1;
  }
  uVar2 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar2 & 1) != 0) {
    sVar4 = sVar4 + *(long *)((uVar2 & 0xfffffffffffffffc) + 0x10);
  }
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = (__int_type)sVar4;
  return sVar4;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }